

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDCImporter::ValidateHeader(MDCImporter *this)

{
  DeadlyImportError *pDVar1;
  Logger *this_00;
  allocator local_b9;
  string local_b8;
  undefined1 local_92;
  allocator local_91;
  string local_90;
  undefined1 local_6d;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  MDCImporter *pMStack_10;
  char szBuffer [5];
  MDCImporter *this_local;
  
  pMStack_10 = this;
  if ((this->pcHeader->ulIdent != 0x43504449) && (this->pcHeader->ulIdent != 0x49445043)) {
    local_15 = (char)this->pcHeader->ulIdent;
    local_14 = *(undefined1 *)((long)&this->pcHeader->ulIdent + 1);
    local_13 = *(undefined1 *)((long)&this->pcHeader->ulIdent + 2);
    local_12 = *(undefined1 *)((long)&this->pcHeader->ulIdent + 3);
    local_11 = 0;
    local_6d = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,&local_15,&local_59);
    std::operator+(&local_38,"Invalid MDC magic word: should be IDPC, the magic word found is ",
                   &local_58);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_38);
    local_6d = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (this->pcHeader->ulVersion != 2) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
  }
  if ((ulong)this->pcHeader->ulOffsetBorderFrames + (ulong)this->pcHeader->ulNumFrames * 0x38 <=
      (ulong)this->fileSize) {
    if ((ulong)this->pcHeader->ulOffsetSurfaces + (ulong)this->pcHeader->ulNumSurfaces * 0x7c <=
        (ulong)this->fileSize) {
      if (this->pcHeader->ulNumFrames <= this->configFrameID) {
        pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b8,"The requested frame is not available",&local_b9);
        DeadlyImportError::DeadlyImportError(pDVar1,&local_b8);
        __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      return;
    }
  }
  local_92 = 1;
  pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "Some of the offset values in the MDC header are invalid and point to something behind the file."
             ,&local_91);
  DeadlyImportError::DeadlyImportError(pDVar1,&local_90);
  local_92 = 0;
  __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDCImporter::ValidateHeader()
{
    AI_SWAP4( this->pcHeader->ulVersion );
    AI_SWAP4( this->pcHeader->ulFlags );
    AI_SWAP4( this->pcHeader->ulNumFrames );
    AI_SWAP4( this->pcHeader->ulNumTags );
    AI_SWAP4( this->pcHeader->ulNumSurfaces );
    AI_SWAP4( this->pcHeader->ulNumSkins );
    AI_SWAP4( this->pcHeader->ulOffsetBorderFrames );

    if (pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_BE &&
        pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&pcHeader->ulIdent)[0];
        szBuffer[1] = ((char*)&pcHeader->ulIdent)[1];
        szBuffer[2] = ((char*)&pcHeader->ulIdent)[2];
        szBuffer[3] = ((char*)&pcHeader->ulIdent)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MDC magic word: should be IDPC, the "
            "magic word found is " + std::string( szBuffer ));
    }

    if (pcHeader->ulVersion != AI_MDC_VERSION) {
        ASSIMP_LOG_WARN("Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
    }

    if (pcHeader->ulOffsetBorderFrames + pcHeader->ulNumFrames * sizeof(MDC::Frame) > this->fileSize ||
        pcHeader->ulOffsetSurfaces + pcHeader->ulNumSurfaces * sizeof(MDC::Surface) > this->fileSize)
    {
        throw DeadlyImportError("Some of the offset values in the MDC header are invalid "
            "and point to something behind the file.");
    }

    if (this->configFrameID >= this->pcHeader->ulNumFrames) {
        throw DeadlyImportError("The requested frame is not available");
    }
}